

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

ssize_t __thiscall
QHttpNetworkReply::read(QHttpNetworkReply *this,int __fd,void *__buf,size_t __nbytes)

{
  long lVar1;
  undefined4 in_register_00000034;
  
  lVar1 = *(long *)(CONCAT44(in_register_00000034,__fd) + 8);
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  QByteArray::resize((longlong)this);
  if ((*(int **)this == (int *)0x0) || (1 < **(int **)this)) {
    QByteArray::reallocData((longlong)this,(AllocationOption)*(undefined8 *)(this + 0x10));
  }
  QByteDataBuffer::read
            ((QByteDataBuffer *)(lVar1 + 400),(int)*(undefined8 *)(this + 8),*(void **)(this + 0x10)
             ,__nbytes);
  return (ssize_t)this;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }